

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_context_init__null
                    (ma_context *pContext,ma_context_config *pConfig,
                    ma_backend_callbacks *pCallbacks)

{
  if (pContext != (ma_context *)0x0) {
    pCallbacks->onContextInit = ma_context_init__null;
    pCallbacks->onContextUninit = ma_context_uninit__null;
    pCallbacks->onContextEnumerateDevices = ma_context_enumerate_devices__null;
    pCallbacks->onContextGetDeviceInfo = ma_context_get_device_info__null;
    pCallbacks->onDeviceInit = ma_device_init__null;
    pCallbacks->onDeviceUninit = ma_device_uninit__null;
    pCallbacks->onDeviceStart = ma_device_start__null;
    pCallbacks->onDeviceStop = ma_device_stop__null;
    pCallbacks->onDeviceRead = ma_device_read__null;
    pCallbacks->onDeviceWrite = ma_device_write__null;
    pCallbacks->onDeviceDataLoop = (_func_ma_result_ma_device_ptr *)0x0;
    return MA_SUCCESS;
  }
  __assert_fail("pContext != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/miniaudio.h"
                ,0x4d6e,
                "ma_result ma_context_init__null(ma_context *, const ma_context_config *, ma_backend_callbacks *)"
               );
}

Assistant:

static ma_result ma_context_init__null(ma_context* pContext, const ma_context_config* pConfig, ma_backend_callbacks* pCallbacks)
{
    MA_ASSERT(pContext != NULL);

    (void)pConfig;
    (void)pContext;

    pCallbacks->onContextInit             = ma_context_init__null;
    pCallbacks->onContextUninit           = ma_context_uninit__null;
    pCallbacks->onContextEnumerateDevices = ma_context_enumerate_devices__null;
    pCallbacks->onContextGetDeviceInfo    = ma_context_get_device_info__null;
    pCallbacks->onDeviceInit              = ma_device_init__null;
    pCallbacks->onDeviceUninit            = ma_device_uninit__null;
    pCallbacks->onDeviceStart             = ma_device_start__null;
    pCallbacks->onDeviceStop              = ma_device_stop__null;
    pCallbacks->onDeviceRead              = ma_device_read__null;
    pCallbacks->onDeviceWrite             = ma_device_write__null;
    pCallbacks->onDeviceDataLoop          = NULL;   /* Our backend is asynchronous with a blocking read-write API which means we can get miniaudio to deal with the audio thread. */

    /* The null backend always works. */
    return MA_SUCCESS;
}